

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

bool __thiscall
GF2::MI<136UL,_GF2::MOGrevlex<136UL>_>::ReduceClassic
          (MI<136UL,_GF2::MOGrevlex<136UL>_> *this,MP<136UL,_GF2::MOGrevlex<136UL>_> *polyRight)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  MM<136UL> *m2;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *this_00;
  MM<136UL> *in_RDI;
  const_iterator iterPoly;
  iterator iterMon;
  MP<136UL,_GF2::MOGrevlex<136UL>_> poly;
  bool changed;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff48;
  const_iterator in_stack_ffffffffffffff68;
  _Self local_58;
  _Self local_50;
  _Self local_48;
  _Self local_40;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *in_stack_ffffffffffffffc8;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *in_stack_ffffffffffffffd0;
  byte local_11;
  
  local_11 = 0;
  MP<136UL,_GF2::MOGrevlex<136UL>_>::MP
            (in_stack_ffffffffffffff20,
             (MOGrevlex<136UL> *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::begin
                 ((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)
                  CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  do {
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::end
                   ((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)
                    CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    bVar1 = std::operator!=(&local_40,&local_48);
    if (!bVar1) {
      MP<136UL,_GF2::MOGrevlex<136UL>_>::~MP((MP<136UL,_GF2::MOGrevlex<136UL>_> *)0x18094f);
      return (bool)(local_11 & 1);
    }
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
         ::begin((list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    while( true ) {
      local_58._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
           ::end((list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      bVar1 = std::operator!=(&local_50,&local_58);
      if (!bVar1) break;
      std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>::operator->
                ((_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_> *)0x180762);
      m2 = MP<136UL,_GF2::MOGrevlex<136UL>_>::LM(in_stack_ffffffffffffff20);
      std::_List_iterator<GF2::MM<136UL>_>::operator*((_List_iterator<GF2::MM<136UL>_> *)0x18077e);
      iVar3 = MOGrevlex<136UL>::Compare
                        ((MOGrevlex<136UL> *)in_stack_ffffffffffffff68._M_node,in_RDI,m2);
      if (0 < iVar3) {
        local_50._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
             ::end((list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        break;
      }
      std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>::operator->
                ((_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_> *)0x1807f3);
      this_00 = (MP<136UL,_GF2::MOGrevlex<136UL>_> *)
                MP<136UL,_GF2::MOGrevlex<136UL>_>::LM(in_stack_ffffffffffffff20);
      std::_List_iterator<GF2::MM<136UL>_>::operator*((_List_iterator<GF2::MM<136UL>_> *)0x18080f);
      uVar2 = MM<136ul>::operator|
                        ((MM<136UL> *)in_stack_ffffffffffffff20,
                         (MM<136UL> *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18))
      ;
      if ((bool)uVar2) {
        local_11 = 1;
        std::_List_iterator<GF2::MM<136UL>_>::operator*((_List_iterator<GF2::MM<136UL>_> *)0x180844)
        ;
        std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>::operator->
                  ((_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_> *)0x180856);
        MP<136UL,_GF2::MOGrevlex<136UL>_>::LM(in_stack_ffffffffffffff20);
        operator/((MM<136UL> *)CONCAT44(iVar3,in_stack_ffffffffffffff48),(MM<136UL> *)this_00);
        std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>::operator*
                  ((_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_> *)
                   in_stack_ffffffffffffff20);
        in_stack_ffffffffffffff20 =
             MP<136UL,_GF2::MOGrevlex<136UL>_>::operator=
                       (in_stack_ffffffffffffff20,
                        (MP<136UL,_GF2::MOGrevlex<136UL>_> *)
                        CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        MP<136UL,_GF2::MOGrevlex<136UL>_>::operator*=
                  (this_00,(MM<136UL> *)CONCAT17(uVar2,in_stack_ffffffffffffff38));
        MP<136UL,_GF2::MOGrevlex<136UL>_>::SymDiffSplice
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        local_40._M_node =
             (_List_node_base *)
             std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::begin
                       ((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)
                        CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        break;
      }
      std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>::operator++(&local_50);
    }
    in_stack_ffffffffffffff68 =
         std::__cxx11::
         list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
         ::end((list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    bVar1 = std::operator==(&local_50,(_Self *)&stack0xffffffffffffff68);
    if (bVar1) {
      std::_List_iterator<GF2::MM<136UL>_>::operator++(&local_40);
    }
  } while( true );
}

Assistant:

bool ReduceClassic(MP<_n, _O>& polyRight) const
	{	
		assert(IsConsistent(polyRight));
		bool changed = false;
		MP<_n, _O> poly(_order);
		// двигаемся от старших мономов polyRight к младшим
		auto iterMon = polyRight.begin();
		while (iterMon != polyRight.end())
		{
			// двигаемся от младших многочленов системы к старшим
			const_iterator iterPoly = begin();
			for (; iterPoly != end(); ++iterPoly)
			{
				// прекращаем заведомо нерезультативные итерации
				if (_order.Compare(iterPoly->LM(), *iterMon) > 0)
				{
					iterPoly = end();
					break;
				}
				// делим при возможности
				else if (iterPoly->LM() | *iterMon)
				{
					changed = true;
					(poly = *iterPoly) *= *iterMon / iterPoly->LM();
					polyRight.SymDiffSplice(poly);
					iterMon = polyRight.begin();
					break;
				}
			}
			if (iterPoly == end())
				++iterMon;
		}
		return changed;
	}